

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

EdgeBool * __thiscall
indigox::utils::
Graph<indigox::PermVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::AddEdge
          (EdgeBool *__return_storage_ptr__,
          Graph<indigox::PermVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
          *this,_List_node_base *u,_List_node_base *v)

{
  _List_node_base **pp_Var1;
  size_t *psVar2;
  element_type *peVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _Base_ptr p_Var6;
  OutEdgeList *el;
  bool bVar7;
  pair<std::_Rb_tree_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_bool>
  pVar8;
  stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>
  local_50;
  _Base_ptr local_40;
  uid_t local_38;
  
  pp_Var1 = &u->_M_prev;
  p_Var5 = (_List_node_base *)pp_Var1;
  for (p_Var4 = u[1]._M_next; p_Var4 != (_List_node_base *)0x0; p_Var4 = (&p_Var4[1]._M_next)[bVar7]
      ) {
    bVar7 = p_Var4[2]._M_next < v;
    if (!bVar7) {
      p_Var5 = p_Var4;
    }
  }
  p_Var4 = (_List_node_base *)pp_Var1;
  if ((p_Var5 != (_List_node_base *)pp_Var1) && (p_Var4 = p_Var5, v < p_Var5[2]._M_next)) {
    p_Var4 = (_List_node_base *)pp_Var1;
  }
  if (p_Var4 == (_List_node_base *)pp_Var1) {
    p_Var6 = (_Base_ptr)0x0;
  }
  else {
    p_Var6 = (_Base_ptr)(p_Var4[2]._M_prev + 2);
  }
  bVar7 = false;
  if ((u != v) && (bVar7 = false, p_Var4 == (_List_node_base *)pp_Var1)) {
    peVar3 = (this->graph_).
             super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var4 = (_List_node_base *)operator_new(0x28);
    p_Var4[1]._M_next = u;
    p_Var4[1]._M_prev = v;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar2 = (size_t *)
             ((long)&(peVar3->super_type).m_edges.
                     super__List_base<boost::list_edge<void_*,_indigox::utils::NoProperty>,_std::allocator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>_>
                     ._M_impl + 0x10);
    *psVar2 = *psVar2 + 1;
    p_Var6 = *(_Base_ptr *)
              ((long)&(peVar3->super_type).m_edges.
                      super__List_base<boost::list_edge<void_*,_indigox::utils::NoProperty>,_std::allocator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>_>
                      ._M_impl + 8);
    local_50.super_stored_edge<void_*>.m_target = v;
    local_50.m_iter._M_node = (_List_node_base *)p_Var6;
    pVar8 = std::
            _Rb_tree<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>,boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>,std::_Identity<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>,std::less<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>,std::allocator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>>
            ::
            _M_insert_unique<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>
                      ((_Rb_tree<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>,boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>,std::_Identity<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>,std::less<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>,std::allocator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>>
                        *)u,&local_50);
    bVar7 = ((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    if (bVar7) {
      psVar2 = (size_t *)
               ((long)&(peVar3->super_type).m_edges.
                       super__List_base<boost::list_edge<void_*,_indigox::utils::NoProperty>,_std::allocator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>_>
                       ._M_impl + 0x10);
      *psVar2 = *psVar2 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var6,0x28);
      p_Var6 = pVar8.first._M_node._M_node[1]._M_parent;
    }
    else {
      local_50.super_stored_edge<void_*>.m_target = u;
      local_50.m_iter._M_node = (_List_node_base *)p_Var6;
      std::
      _Rb_tree<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>,boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>,std::_Identity<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>,std::less<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>,std::allocator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>>
      ::
      _M_insert_unique<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>
                ((_Rb_tree<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>,boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>,std::_Identity<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>,std::less<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>,std::allocator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,indigox::utils::NoProperty>>,indigox::utils::NoProperty>>>
                  *)v,&local_50);
    }
    bVar7 = !bVar7;
    p_Var6 = p_Var6 + 1;
    local_38 = this->next_edge_id_;
    this->next_edge_id_ = local_38 + 1;
    local_50.super_stored_edge<void_*>.m_target = u;
    local_50.m_iter._M_node = v;
    local_40 = p_Var6;
    boost::multi_index::
    multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
    ::insert_<boost::multi_index::detail::lvalue_tag>
              ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                *)(*(ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                     **)((long)&(this->edge_idxmap_).super_relation_set.
                                super_set_adaptor<_c9ff9997_>.
                                super_ordered_associative_container_adaptor<_7d573cef_>.super_type.
                                super_type.dwfb + 8) + -8));
  }
  (__return_storage_ptr__->first).super_edge_base<boost::undirected_tag,_void_*>.m_source = u;
  (__return_storage_ptr__->first).super_edge_base<boost::undirected_tag,_void_*>.m_target = v;
  (__return_storage_ptr__->first).m_eproperty = p_Var6;
  __return_storage_ptr__->second = bVar7;
  return __return_storage_ptr__;
}

Assistant:

EdgeBool AddEdge(VertType u, VertType v, EdgeProp p)
      {
        EdgeBool e = boost::edge(u, v, *graph_);
        if (u == v)
          return std::make_pair(e.first, false);
        if (e.second)
          return std::make_pair(e.first, false);
        e = boost::add_edge(u, v, p, *graph_);
        edge_idxmap_.insert({e.first, next_edge_id_++});
        return e;
      }